

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.cc
# Opt level: O0

h2o_compress_context_t *
h2o_compress_brotli_open(h2o_mem_pool_t *pool,int quality,size_t estimated_content_length)

{
  brotli_context *this;
  brotli_context *ctx;
  size_t estimated_content_length_local;
  int quality_local;
  h2o_mem_pool_t *pool_local;
  
  this = (brotli_context *)
         h2o_mem_alloc_shared(pool,0x50,anon_unknown.dwarf_e9210::brotli_context::dispose);
  anon_unknown.dwarf_e9210::brotli_context::brotli_context(this,quality,estimated_content_length);
  return &this->super_h2o_compress_context_t;
}

Assistant:

h2o_compress_context_t *h2o_compress_brotli_open(h2o_mem_pool_t *pool, int quality, size_t estimated_content_length)
{
    brotli_context *ctx = static_cast<brotli_context *>(h2o_mem_alloc_shared(pool, sizeof(*ctx), brotli_context::dispose));
    return new (ctx) brotli_context(quality, estimated_content_length);
}